

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int ctl_lookupbymib(tsdn_t *tsdn,ctl_named_node_t **ending_nodep,size_t *mib,size_t miblen)

{
  ctl_node_t *pcVar1;
  ctl_named_node_t *pcVar2;
  int iVar3;
  ulong uVar4;
  ctl_named_node_t *children;
  bool bVar5;
  bool bVar6;
  
  bVar5 = miblen != 0;
  if (miblen == 0) {
    pcVar2 = super_root_node;
  }
  else {
    pcVar2 = super_root_node;
    uVar4 = 1;
    do {
      pcVar1 = pcVar2->children;
      if (pcVar1->named == true) {
        if (pcVar2->nchildren <= mib[uVar4 - 1]) break;
        pcVar2 = (ctl_named_node_t *)(pcVar1 + mib[uVar4 - 1] * 0x28);
      }
      else {
        pcVar2 = (ctl_named_node_t *)(**(code **)(pcVar1 + 8))(tsdn,mib,miblen);
        if (pcVar2 == (ctl_named_node_t *)0x0) break;
      }
      bVar5 = uVar4 < miblen;
      bVar6 = uVar4 != miblen;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  iVar3 = 2;
  if (!bVar5) {
    *ending_nodep = pcVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
ctl_lookupbymib(tsdn_t *tsdn, const ctl_named_node_t **ending_nodep,
    const size_t *mib, size_t miblen) {
	int ret;

	const ctl_named_node_t *node = super_root_node;
	for (size_t i = 0; i < miblen; i++) {
		assert(node);
		assert(node->nchildren > 0);
		if (ctl_named_node(node->children) != NULL) {
			/* Children are named. */
			if (node->nchildren <= mib[i]) {
				ret = ENOENT;
				goto label_return;
			}
			node = ctl_named_children(node, mib[i]);
		} else {
			const ctl_indexed_node_t *inode;

			/* Indexed element. */
			inode = ctl_indexed_node(node->children);
			node = inode->index(tsdn, mib, miblen, mib[i]);
			if (node == NULL) {
				ret = ENOENT;
				goto label_return;
			}
		}
	}
	assert(ending_nodep != NULL);
	*ending_nodep = node;
	ret = 0;

label_return:
	return(ret);
}